

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.hpp
# Opt level: O1

exp_number __thiscall
ising::free_energy::square::transfer_matrix<float>::product_U
          (transfer_matrix<float> *this,uint_t Ly,real_t Jx,real_t beta,exp_number *factor,
          vector<float,_std::allocator<float>_> *v,vector<float,_std::allocator<float>_> *v_10,
          vector<float,_std::allocator<float>_> *v_20,vector<float,_std::allocator<float>_> *v_01,
          vector<float,_std::allocator<float>_> *v_02,vector<float,_std::allocator<float>_> *vt)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  pointer pfVar5;
  pointer pfVar6;
  byte bVar7;
  uint_t uVar8;
  uint_t c0;
  ulong uVar9;
  uint_t c0_1;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  exp_number<float> local_38;
  
  uVar11 = (ulong)(1 << ((byte)Ly & 0x1f));
  fVar12 = expf(Jx * beta);
  fVar13 = expf(-beta * Jx);
  if (Ly != 0) {
    uVar8 = 0;
    do {
      bVar7 = (byte)uVar8;
      pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3 = (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar4 = (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        uVar10 = uVar9 ^ (long)(1 << (bVar7 & 0x1f));
        pfVar4[uVar9] =
             pfVar3[uVar10] * fVar13 + pfVar3[uVar9] * fVar12 +
             (Jx + Jx) * (pfVar2[uVar9] * fVar12 + pfVar2[uVar10] * -fVar13) +
             (pfVar1[uVar9] * fVar12 + pfVar1[uVar10] * fVar13) * Jx * Jx;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      pfVar1 = (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2 = (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar3 = (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pfVar4 = (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar4;
      (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar1;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar2;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar3;
      pfVar4 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar5 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        uVar10 = uVar9 ^ (long)(1 << (bVar7 & 0x1f));
        pfVar1[uVar9] =
             pfVar5[uVar9] * fVar12 + pfVar5[uVar10] * fVar13 +
             (pfVar4[uVar9] * fVar12 + pfVar4[uVar10] * -fVar13) * Jx;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      pfVar4 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar5 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar6 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar1;
      (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar2;
      (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar3;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar4;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar5;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar6;
      pfVar1 = (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        pfVar4[uVar9] =
             pfVar1[uVar9] * fVar12 + pfVar1[uVar9 ^ (long)(1 << (bVar7 & 0x1f))] * fVar13;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      pfVar1 = (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2 = (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar3 = (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar4;
      (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar5;
      (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar6;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar1;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar2;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar3;
      pfVar4 = (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        pfVar1[uVar9] =
             pfVar4[uVar9] * fVar12 + pfVar4[uVar9 ^ (long)(1 << (bVar7 & 0x1f))] * fVar13;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      pfVar4 = (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar5 = (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar6 = (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar1;
      (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar2;
      (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar3;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar4;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar5;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar6;
      pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        pfVar4[uVar9] =
             pfVar1[uVar9] * fVar12 + pfVar1[uVar9 ^ (long)(1 << (bVar7 & 0x1f))] * fVar13;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      pfVar1 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar6;
      pfVar2 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar4;
      (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar5;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = pfVar2;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar3;
      (vt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pfVar1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != Ly);
  }
  fVar12 = 0.0;
  uVar9 = 0;
  do {
    fVar13 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_start[uVar9];
    fVar12 = fVar12 + fVar13 * fVar13;
    uVar9 = uVar9 + 1;
  } while (uVar11 != uVar9);
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    fVar12 = SQRT(fVar12);
  }
  fVar12 = 1.0 / fVar12;
  pfVar1 = (v_20->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar2 = (v_10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar3 = (v_02->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar4 = (v_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfVar5 = (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar9 = 0;
  do {
    pfVar1[uVar9] = pfVar1[uVar9] * fVar12;
    pfVar2[uVar9] = pfVar2[uVar9] * fVar12;
    pfVar3[uVar9] = pfVar3[uVar9] * fVar12;
    pfVar4[uVar9] = pfVar4[uVar9] * fVar12;
    pfVar5[uVar9] = pfVar5[uVar9] * fVar12;
    uVar9 = uVar9 + 1;
  } while (uVar11 != uVar9);
  *(value_type_conflict *)this = factor->log_;
  *(int32_t *)(this + 4) = factor->sign_;
  standards::exp_number<float>::exp_number(&local_38,fVar12);
  standards::exp_number<float>::operator/=((exp_number<float> *)this,&local_38);
  return (exp_number)this;
}

Assistant:

static exp_number product_U(uint_t Ly, real_t Jx, real_t beta,
                              exp_number factor, std::vector<real_t> &v,
                              std::vector<real_t> &v_10,
                              std::vector<real_t> &v_20,
                              std::vector<real_t> &v_01,
                              std::vector<real_t> &v_02,
                              std::vector<real_t> &vt) {
    uint_t dim = 1 << Ly;
    boost::array<double, 2> weight;
    weight[0] = std::exp(beta * Jx);
    weight[1] = std::exp(-beta * Jx);
    for (uint_t s = 0; s < Ly; ++s) {
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * Jx * (weight[0] * v[c0] + weight[1] * v[c1]) +
                 2 * Jx * (weight[0] * v_10[c0] - weight[1] * v_10[c1]) +
                 (weight[0] * v_20[c0] + weight[1] * v_20[c1]);
      }
      std::swap(v_20, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = Jx * (weight[0] * v[c0] - weight[1] * v[c1]) +
                 (weight[0] * v_10[c0] + weight[1] * v_10[c1]);
      }
      std::swap(v_10, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_02[c0] + weight[1] * v_02[c1]);
      }
      std::swap(v_02, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = (weight[0] * v_01[c0] + weight[1] * v_01[c1]);
      }
      std::swap(v_01, vt);
      for (uint_t c0 = 0; c0 < dim; ++c0) {
        uint_t c1 = c0 ^ (1 << s);
        vt[c0] = weight[0] * v[c0] + weight[1] * v[c1];
      }
      std::swap(v, vt);
    }
    real_t norm2 = 0;
    for (uint_t c = 0; c < dim; ++c) {
      norm2 += v[c] * v[c];
    }
    real_t norm_inv = 1 / std::sqrt(norm2);
    for (uint_t c = 0; c < dim; ++c) {
      v_20[c] *= norm_inv;
      v_10[c] *= norm_inv;
      v_02[c] *= norm_inv;
      v_01[c] *= norm_inv;
      v[c] *= norm_inv;
    }
    return factor / norm_inv;
  }